

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O2

int run_ipc_send_recv_pipe(int inprocess)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  ctx.expected_type = UV_NAMED_PIPE;
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,0x304428,1);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_pipe_bind(0x304428,"/tmp/uv-test-sock");
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      uVar2 = uv_default_loop();
      iVar1 = uv_pipe_init(uVar2,0x304540,1);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        iVar1 = uv_pipe_bind(0x304540,"/tmp/uv-test-sock2");
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          run_test(inprocess);
          loop = (uv_loop_t *)uv_default_loop();
          close_loop(loop);
          eval_a = 0;
          uVar2 = uv_default_loop();
          iVar1 = uv_loop_close(uVar2);
          eval_b = (int64_t)iVar1;
          if (eval_b == 0) {
            iVar1 = uv_library_shutdown();
            return iVar1;
          }
          pcVar4 = "uv_loop_close(uv_default_loop())";
          pcVar3 = "0";
          uVar2 = 0xe2;
        }
        else {
          pcVar4 = "0";
          pcVar3 = "r";
          uVar2 = 0xdd;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "r";
        uVar2 = 0xda;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "r";
      uVar2 = 0xd7;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "r";
    uVar2 = 0xd4;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc-send-recv.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

static int run_ipc_send_recv_pipe(int inprocess) {
  int r;

  ctx.expected_type = UV_NAMED_PIPE;

  r = uv_pipe_init(uv_default_loop(), &ctx.send.pipe, 1);
  ASSERT_OK(r);

  r = uv_pipe_bind(&ctx.send.pipe, TEST_PIPENAME);
  ASSERT_OK(r);

  r = uv_pipe_init(uv_default_loop(), &ctx.send2.pipe, 1);
  ASSERT_OK(r);

  r = uv_pipe_bind(&ctx.send2.pipe, TEST_PIPENAME_2);
  ASSERT_OK(r);

  r = run_test(inprocess);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}